

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_attribute.h
# Opt level: O1

bool __thiscall
draco::GeometryAttribute::ConvertTypedValue<double,int>
          (GeometryAttribute *this,AttributeValueIndex att_id,uint8_t out_num_components,
          int *out_value)

{
  bool bVar1;
  double *pdVar2;
  uint uVar3;
  byte bVar4;
  double *pdVar5;
  ulong uVar6;
  bool bVar7;
  double dVar8;
  
  uVar3 = *(uint *)&this->num_components_;
  bVar4 = out_num_components;
  if ((byte)uVar3 < out_num_components) {
    bVar4 = (byte)uVar3;
  }
  bVar7 = bVar4 == 0;
  if (bVar7) {
LAB_001194da:
    if ((byte)uVar3 < out_num_components) {
      memset(out_value + (uVar3 & 0xff),0,
             (ulong)((uint)out_num_components + ~(uVar3 & 0xff)) * 4 + 4);
    }
  }
  else {
    pdVar5 = (double *)
             ((this->buffer_->data_).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start +
             this->byte_offset_ + (ulong)att_id.value_ * this->byte_stride_);
    pdVar2 = (double *)
             (this->buffer_->data_).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar5 < pdVar2) {
      bVar1 = this->normalized_;
      uVar6 = 1;
      do {
        dVar8 = *pdVar5;
        if (2147483647.0 <= dVar8) {
          return bVar7;
        }
        if (dVar8 < -2147483648.0) {
          return bVar7;
        }
        if (0x7fefffffffffffff < (ulong)ABS(dVar8)) {
          return bVar7;
        }
        if ((bVar1 & 1U) != 0) {
          if (1.0 < dVar8) {
            return bVar7;
          }
          if (dVar8 < 0.0) {
            return bVar7;
          }
          dVar8 = floor(dVar8 * 2147483647.0 + 0.5);
        }
        out_value[uVar6 - 1] = (int)dVar8;
        uVar3 = *(uint *)&this->num_components_;
        bVar4 = (byte)uVar3;
        if (out_num_components <= (byte)uVar3) {
          bVar4 = out_num_components;
        }
        bVar7 = bVar4 <= uVar6;
        if (bVar7) goto LAB_001194da;
        pdVar5 = pdVar5 + 1;
        uVar6 = uVar6 + 1;
      } while (pdVar5 < pdVar2);
    }
  }
  return bVar7;
}

Assistant:

bool ConvertTypedValue(AttributeValueIndex att_id, uint8_t out_num_components,
                         OutT *out_value) const {
    const uint8_t *src_address = GetAddress(att_id);

    // Convert all components available in both the original and output formats.
    for (int i = 0; i < std::min(num_components_, out_num_components); ++i) {
      if (!IsAddressValid(src_address)) {
        return false;
      }
      const T in_value = *reinterpret_cast<const T *>(src_address);
      if (!ConvertComponentValue<T, OutT>(in_value, normalized_,
                                          out_value + i)) {
        return false;
      }
      src_address += sizeof(T);
    }
    // Fill empty data for unused output components if needed.
    for (int i = num_components_; i < out_num_components; ++i) {
      out_value[i] = static_cast<OutT>(0);
    }
    return true;
  }